

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::InitDefaultsImpl(void)

{
  TreeEnsembleParameters *pTVar1;
  TreeEnsembleClassifier *pTVar2;
  TreeEnsembleRegressor *pTVar3;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                    *)_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode> *)
             _TreeEnsembleParameters_TreeNode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters> *)
                   _TreeEnsembleParameters_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier> *)
                   _TreeEnsembleClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor> *)
                   _TreeEnsembleRegressor_default_instance_);
  pTVar1 = TreeEnsembleParameters::internal_default_instance();
  pTVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier> *)
                      _TreeEnsembleClassifier_default_instance_);
  pTVar2->treeensemble_ = pTVar1;
  pTVar1 = TreeEnsembleParameters::internal_default_instance();
  pTVar3 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor> *)
                      _TreeEnsembleRegressor_default_instance_);
  pTVar3->treeensemble_ = pTVar1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.DefaultConstruct();
  _TreeEnsembleParameters_TreeNode_default_instance_.DefaultConstruct();
  _TreeEnsembleParameters_default_instance_.DefaultConstruct();
  _TreeEnsembleClassifier_default_instance_.DefaultConstruct();
  _TreeEnsembleRegressor_default_instance_.DefaultConstruct();
  _TreeEnsembleClassifier_default_instance_.get_mutable()->treeensemble_ = const_cast< ::CoreML::Specification::TreeEnsembleParameters*>(
      ::CoreML::Specification::TreeEnsembleParameters::internal_default_instance());
  _TreeEnsembleRegressor_default_instance_.get_mutable()->treeensemble_ = const_cast< ::CoreML::Specification::TreeEnsembleParameters*>(
      ::CoreML::Specification::TreeEnsembleParameters::internal_default_instance());
}